

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

RecordField * anon_unknown.dwarf_7075e::GetRecordField(ID *id,Env *env)

{
  FieldType FVar1;
  RecordField *this;
  undefined8 uVar2;
  RecordField *r;
  Field *field;
  ID *in_stack_ffffffffffffff88;
  Env *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffb4;
  Object *in_stack_ffffffffffffffb8;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  this = (RecordField *)Env::GetField(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  FVar1 = Field::tof((Field *)this);
  if (FVar1 != RECORD_FIELD) {
    FVar1 = Field::tof((Field *)this);
    if (FVar1 != PADDING_FIELD) {
      uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
      uVar2 = __cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      Exception::Exception
                ((Exception *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 (string *)CONCAT44(in_stack_ffffffffffffffb4,uVar3));
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return this;
}

Assistant:

RecordField* GetRecordField(const ID* id, Env* env)
	{
	Field* field = env->GetField(id);
	ASSERT(field);
	if ( field->tof() != RECORD_FIELD && field->tof() != PADDING_FIELD )
		throw Exception(id, "not a record field");
	RecordField* r = static_cast<RecordField*>(field);
	ASSERT(r);
	return r;
	}